

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  int iVar3;
  CURLUcode CVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  redircase *prVar9;
  uint uVar10;
  char *pcVar11;
  querycase *pqVar12;
  char *pcVar13;
  bool bVar14;
  char *url_2;
  char *url;
  char part [80];
  char value [80];
  setcase *local_158;
  char *local_150;
  char *local_148 [11];
  char *local_f0;
  undefined4 local_e8;
  char cStack_e4;
  undefined1 uStack_e3;
  undefined1 uStack_e2;
  undefined1 uStack_e1;
  char local_e0;
  long local_90;
  undefined4 local_88;
  char local_84;
  
  uVar5 = curl_url();
  iVar1 = curl_url_set(uVar5,0,"https://[fe80::20c:29ff:fe9c:409b%25eth0]/hello.html",0);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3b1,iVar1);
  }
  uVar10 = (uint)(iVar1 != 0);
  iVar1 = curl_url_get(uVar5,5,local_148,0);
  if (iVar1 == 0) {
    curl_mprintf("we got %s\n",local_148[0]);
    curl_free(local_148[0]);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3b8,iVar1);
    uVar10 = uVar10 + 1;
  }
  iVar1 = curl_url_set(uVar5,5,"[::1]",0);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3c3,iVar1);
    uVar10 = uVar10 + 1;
  }
  iVar1 = curl_url_get(uVar5,0,local_148,0);
  if (iVar1 == 0) {
    curl_mprintf("we got %s\n",local_148[0]);
    curl_free(local_148[0]);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3ca,iVar1);
    uVar10 = uVar10 + 1;
  }
  iVar1 = curl_url_set(uVar5,5,"example.com",0);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3d5,iVar1);
    uVar10 = uVar10 + 1;
  }
  iVar1 = curl_url_get(uVar5,0,local_148,0);
  if (iVar1 == 0) {
    curl_mprintf("we got %s\n",local_148[0]);
    curl_free(local_148[0]);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3dc,iVar1);
    uVar10 = uVar10 + 1;
  }
  iVar1 = curl_url_set(uVar5,5,"[fe80::20c:29ff:fe9c:409b%25eth0]",0);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,1000,iVar1);
    uVar10 = uVar10 + 1;
  }
  iVar1 = curl_url_get(uVar5,0,local_148,0);
  if (iVar1 == 0) {
    curl_mprintf("we got %s\n",local_148[0]);
    curl_free(local_148[0]);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3ef,iVar1);
    uVar10 = uVar10 + 1;
  }
  iVar1 = curl_url_get(uVar5,5,local_148,0);
  if (iVar1 == 0) {
    curl_mprintf("we got %s\n",local_148[0]);
    curl_free(local_148[0]);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3fa,iVar1);
    uVar10 = uVar10 + 1;
  }
  iVar1 = curl_url_get(uVar5,10,local_148,0);
  if (iVar1 == 0) {
    curl_mprintf("we got %s\n",local_148[0]);
    curl_free(local_148[0]);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_ZONEID returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x405,iVar1);
    uVar10 = uVar10 + 1;
  }
  iVar1 = curl_url_set(uVar5,10,"clown",0);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_ZONEID returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x410,iVar1);
    uVar10 = 1;
  }
  iVar1 = curl_url_get(uVar5,0,local_148,0);
  if (iVar1 == 0) {
    curl_mprintf("we got %s\n",local_148[0]);
    curl_free(local_148[0]);
    curl_url_cleanup(uVar5);
    iVar1 = 6;
    if (uVar10 == 0) {
      pcVar13 = "HTTP://test/?s";
      pqVar12 = append_list;
      iVar1 = 5;
      do {
        pqVar12 = pqVar12 + 1;
        lVar6 = curl_url();
        if (lVar6 == 0) {
          return 5;
        }
        bVar14 = false;
        iVar2 = curl_url_set(lVar6,0,pcVar13,0);
        if (iVar2 == 0) {
          iVar2 = curl_url_set(lVar6,8,pqVar12[-1].q,pqVar12[-1].qflags | 0x100);
          if (iVar2 == 0) {
            iVar3 = curl_url_get(lVar6,0,local_148);
            if (iVar3 == 0) {
              iVar2 = checkurl(local_148[0],pqVar12[-1].out);
              curl_free(local_148[0]);
              bVar14 = iVar2 == 0;
              goto LAB_00104734;
            }
            pcVar11 = "%s:%d Get URL returned %d\n";
            pcVar13 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
            ;
            iVar2 = 0x397;
          }
          else {
            pcVar11 = "Append\nin: %s\nreturned %d (expected %d)\n";
            iVar3 = 0;
          }
          bVar14 = false;
          curl_mfprintf(_stderr,pcVar11,pcVar13,iVar2,iVar3);
        }
LAB_00104734:
        curl_url_cleanup(lVar6);
        pcVar13 = pqVar12->in;
      } while ((pcVar13 != (char *)0x0) && (bVar14));
      if (bVar14) {
        pcVar13 = "file://localhost/path?query#frag";
        prVar9 = set_url_list;
        do {
          prVar9 = prVar9 + 1;
          lVar6 = curl_url();
          if (lVar6 == 0) goto LAB_001048b7;
          iVar1 = curl_url_set(lVar6,0,pcVar13,0);
          if (iVar1 == 0) {
            pcVar13 = prVar9[-1].set;
            iVar1 = curl_url_set(lVar6,0,pcVar13,0);
            if (iVar1 == 0) {
              local_148[0] = (char *)0x0;
              iVar1 = curl_url_get(lVar6,0,local_148);
              if (iVar1 == 0) {
                iVar1 = checkurl(local_148[0],prVar9[-1].out);
                bVar14 = iVar1 == 0;
              }
              else {
                bVar14 = false;
                curl_mfprintf(_stderr,"%s:%d Get URL returned %d\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                              ,0x2d6,iVar1);
              }
              curl_free(local_148[0]);
            }
            else {
              bVar14 = false;
              curl_mfprintf(_stderr,"%s:%d Set URL %s returned %d\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                            ,0x2cd,pcVar13,iVar1);
            }
          }
          else {
            bVar14 = false;
            curl_mfprintf(_stderr,"Set URL\nin: %s\nreturned %d (expected %d)\n",pcVar13,iVar1,0);
          }
          curl_url_cleanup(lVar6);
          pcVar13 = prVar9->in;
        } while ((pcVar13 != (char *)0x0) && (bVar14));
        iVar1 = 1;
        if (bVar14) {
LAB_001048b7:
          pcVar13 = "scheme=bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbc,";
          lVar6 = 0;
          local_158 = set_parts_list;
          iVar1 = 2;
          do {
            lVar7 = curl_url();
            if (lVar7 == 0) {
              return 2;
            }
            pcVar11 = local_158->in;
            local_90 = lVar6;
            if ((pcVar11 == (char *)0x0) ||
               (CVar4 = curl_url_set(lVar7,0,pcVar11,local_158->urlflags), CVar4 == CURLUE_OK)) {
              local_150 = (char *)0x0;
              uVar10 = local_158->setflags;
              pcVar8 = strchr(pcVar13,0x2c);
              CVar4 = CURLUE_OK;
              pcVar11 = pcVar13;
              if (pcVar8 != (char *)0x0) {
                do {
                  local_f0 = pcVar11;
                  memcpy(local_148,pcVar13,(long)pcVar8 - (long)pcVar13);
                  *(undefined1 *)((long)local_148 + ((long)pcVar8 - (long)pcVar13)) = 0;
                  iVar2 = __isoc99_sscanf(local_148,"%79[^=]=%79[^,]",&local_e8,&local_88);
                  if (iVar2 == 2) {
                    uVar5 = 0;
                    if (local_e8 != 0x6c7275) {
                      if (CONCAT13(uStack_e2,CONCAT12(uStack_e3,CONCAT11(cStack_e4,local_e8._3_1_)))
                          == 0x656d65 && local_e8 == 0x65686373) {
                        uVar5 = 1;
                      }
                      else if (cStack_e4 == '\0' && local_e8 == 0x72657375) {
                        uVar5 = 2;
                      }
                      else if (local_e0 == '\0' &&
                               CONCAT17(uStack_e1,
                                        CONCAT16(uStack_e2,
                                                 CONCAT15(uStack_e3,CONCAT14(cStack_e4,local_e8))))
                               == 0x64726f7773736170) {
                        uVar5 = 3;
                      }
                      else {
                        uVar5 = 4;
                        if (CONCAT17(uStack_e1,
                                     CONCAT16(uStack_e2,
                                              CONCAT15(uStack_e3,CONCAT14(cStack_e4,local_e8)))) !=
                            0x736e6f6974706f) {
                          if (cStack_e4 == '\0' && local_e8 == 0x74736f68) {
                            uVar5 = 5;
                          }
                          else if (cStack_e4 == '\0' && local_e8 == 0x74726f70) {
                            uVar5 = 6;
                          }
                          else if (cStack_e4 == '\0' && local_e8 == 0x68746170) {
                            uVar5 = 7;
                          }
                          else if (CONCAT11(uStack_e3,cStack_e4) == 0x79 && local_e8 == 0x72657571)
                          {
                            uVar5 = 8;
                          }
                          else if (local_e0 == '\0' &&
                                   CONCAT17(uStack_e1,
                                            CONCAT16(uStack_e2,
                                                     CONCAT15(uStack_e3,CONCAT14(cStack_e4,local_e8)
                                                             ))) == 0x746e656d67617266) {
                            uVar5 = 9;
                          }
                          else if (CONCAT13(uStack_e2,
                                            CONCAT12(uStack_e3,CONCAT11(cStack_e4,local_e8._3_1_)))
                                   == 0x646965 && local_e8 == 0x656e6f7a) {
                            uVar5 = 10;
                          }
                          else {
                            curl_mfprintf(_stderr,"UNKNOWN part \'%s\'\n",&local_e8);
                            uVar5 = 9999;
                          }
                        }
                      }
                    }
                    if (local_84 == '\0' && local_88 == 0x4c4c554e) {
                      pcVar13 = (char *)0x0;
                    }
                    else if (local_88._2_1_ == '\0' && (short)local_88 == 0x2222) {
                      pcVar13 = "";
                    }
                    else {
                      pcVar13 = (char *)&local_88;
                    }
                    CVar4 = curl_url_set(lVar7,uVar5,pcVar13,uVar10);
                    pcVar13 = local_f0;
                    if (CVar4 != CURLUE_OK) goto LAB_00104c0f;
                  }
                  pcVar13 = pcVar8 + 1;
                  pcVar8 = strchr(pcVar13,0x2c);
                  pcVar11 = local_f0;
                } while (pcVar8 != (char *)0x0);
                CVar4 = CURLUE_OK;
                pcVar13 = local_f0;
              }
LAB_00104c0f:
              bVar14 = CVar4 != local_158->pcode;
              if (bVar14) {
                curl_mfprintf(_stderr,"updateurl\nin: %s\nreturned %d (expected %d)\n",pcVar13,CVar4
                             );
              }
              iVar2 = curl_url_get(lVar7,0,&local_150,0);
              if (iVar2 == 0) {
                iVar2 = checkurl(local_150,local_158->out);
                bVar14 = iVar2 == 0 && !bVar14;
              }
              else {
                bVar14 = false;
                curl_mfprintf(_stderr,"%s:%d Get URL returned %d\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                              ,0x30b,iVar2);
              }
              curl_free(local_150);
            }
            else {
              bVar14 = true;
              if (CVar4 != local_158->ucode) {
                bVar14 = false;
                curl_mfprintf(_stderr,"Set parts\nin: %s\nreturned %d (expected %d)\n",pcVar11,CVar4
                             );
              }
            }
            curl_url_cleanup(lVar7);
            lVar6 = local_90 + 1;
            pcVar13 = set_parts_list[lVar6].set;
          } while ((pcVar13 != (char *)0x0) && (local_158 = set_parts_list + lVar6, bVar14));
          if (bVar14) {
            iVar2 = get_url();
            iVar1 = 3;
            if (iVar2 == 0) {
              iVar2 = get_parts();
              iVar1 = 4;
              if (iVar2 == 0) {
                iVar1 = 0;
                curl_mprintf("success\n");
              }
            }
          }
        }
      }
    }
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x417,iVar1);
    curl_url_cleanup(uVar5);
    iVar1 = 6;
  }
  return iVar1;
}

Assistant:

static int scopeid(void)
{
  CURLU *u = curl_url();
  int error = 0;
  CURLUcode rc;
  char *url;

  rc = curl_url_set(u, CURLUPART_URL,
                    "https://[fe80::20c:29ff:fe9c:409b%25eth0]/hello.html", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_HOST, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_HOST, "[::1]", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_HOST, "example.com", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_HOST,
                    "[fe80::20c:29ff:fe9c:409b%25eth0]", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_get(u, CURLUPART_HOST, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_get(u, CURLUPART_ZONEID, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_ZONEID returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_ZONEID, "clown", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_ZONEID returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  curl_url_cleanup(u);

  return error;
}